

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O1

RCOError __thiscall RCO::loadAttributes(RCO *this,RCOElement *el,uint32_t offset,uint32_t count)

{
  bool bVar1;
  vector<RCOAttribute,_std::allocator<RCOAttribute>_> *pvVar2;
  __node_base _Var3;
  uint32_t *puVar4;
  vector<RCOAttribute,_std::allocator<RCOAttribute>_> *this_00;
  size_type sVar5;
  int iVar6;
  uint uVar7;
  void *__dest;
  _Node_iterator<std::pair<const_int,_RCOAttribute>,_false,_false> __tmp;
  long lVar8;
  undefined1 *puVar9;
  char *pcVar10;
  pointer pRVar11;
  string *psVar12;
  bool bVar13;
  string ext;
  string id;
  string path;
  unordered_map<int,_RCOAttribute,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_RCOAttribute>_>_>
  filedata_indexes;
  char buf [256];
  undefined8 local_300;
  undefined8 local_2f8;
  undefined1 local_2f0 [20];
  uint32_t local_2dc;
  vector<RCOAttribute,_std::allocator<RCOAttribute>_> *local_2d8;
  void *local_2d0;
  void *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  RCOAttribute local_2a8;
  string local_1b0;
  string local_190;
  _Hashtable<int,_std::pair<const_int,_RCOAttribute>,_std::allocator<std::pair<const_int,_RCOAttribute>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_170;
  string local_138 [8];
  
  local_2d8 = &el->attributes;
  __dest = operator_new__((ulong)count << 4);
  memcpy(__dest,this->mBuffer + offset,(ulong)count << 4);
  local_170._M_buckets = &local_170._M_single_bucket;
  local_170._M_bucket_count = 1;
  local_170._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_170._M_element_count = 0;
  local_170._M_rehash_policy._M_max_load_factor = 1.0;
  local_170._M_rehash_policy._M_next_resize = 0;
  local_170._M_single_bucket = (__node_base_ptr)0x0;
  local_300 = (void *)((ulong)local_300._4_4_ << 0x20);
  local_2dc = count;
  pvVar2 = local_2d8;
  local_2d0 = __dest;
  _Var3._M_nxt = local_170._M_before_begin._M_nxt;
  if (count != 0) {
    uVar7 = 0;
    do {
      local_2a8.name._M_dataplus._M_p = (pointer)((long)&local_2a8 + 0x10);
      local_2a8.s._M_dataplus._M_p = (pointer)((long)&local_2a8 + 0x40);
      local_2a8.name._M_string_length = 0;
      local_2a8.name.field_2._M_local_buf[0] = '\0';
      local_2a8.s._M_string_length = 0;
      local_2a8.s.field_2._M_local_buf[0] = '\0';
      local_2a8.c._M_dataplus._M_p = (pointer)((long)&local_2a8 + 0x60);
      local_2a8.c._M_string_length = 0;
      local_2a8.c.field_2._M_local_buf[0] = L'\0';
      local_2a8.fa.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      local_2a8.fa.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      local_2a8.ia.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2a8.fa.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_2a8.ia.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2a8.ia.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2a8.fileext._M_dataplus._M_p = (pointer)((long)&local_2a8 + 0xc0);
      local_2a8.fileext._M_string_length = 0;
      local_2a8.fileext.field_2._M_local_buf[0] = '\0';
      local_2a8.idstr._M_dataplus._M_p = (pointer)((long)&local_2a8 + 0xe0);
      local_2a8.idstr._M_string_length = 0;
      local_2a8.idstr.field_2._M_local_buf[0] = '\0';
      lVar8 = (long)(int)uVar7 * 0x10;
      local_2a8.type = *(ATTRIBUTE_TYPE *)((long)__dest + lVar8 + 4);
      getStringTableString(this,&local_2a8.name,*(uint32_t *)((long)__dest + lVar8));
      switch(local_2a8.type) {
      case INTEGER:
        local_2a8.i = *(uint32_t *)((long)__dest + lVar8 + 8);
        goto LAB_00104ed2;
      case FLOAT:
        local_2a8.f = *(float *)((long)__dest + lVar8 + 8);
        goto LAB_00104ed2;
      case STRING:
        getStringTableString
                  (this,(string *)((long)&local_2a8 + 0x30),*(uint32_t *)((long)__dest + lVar8 + 8),
                   *(uint32_t *)((long)__dest + lVar8 + 0xc));
        break;
      case CHAR:
        getCharTableChar(this,(u16string *)((long)&local_2a8 + 0x50),
                         *(uint32_t *)((long)__dest + lVar8 + 8),
                         *(uint32_t *)((long)__dest + lVar8 + 0xc));
        break;
      case STYLE_ID:
        getStyleId(this,(string *)((long)&local_2a8 + 0x30),*(uint32_t *)((long)__dest + lVar8 + 8))
        ;
        break;
      case INTEGER_ARRAY:
        getIntArray(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         ((long)&local_2a8 + 0x70),*(uint32_t *)((long)__dest + lVar8 + 8),
                    *(uint32_t *)((long)__dest + lVar8 + 0xc));
        break;
      case FLOAT_ARRAY:
        getFloatArray(this,(vector<float,_std::allocator<float>_> *)((long)&local_2a8 + 0x88),
                      *(uint32_t *)((long)__dest + lVar8 + 8),
                      *(uint32_t *)((long)__dest + lVar8 + 0xc));
        break;
      case DATA:
        bVar1 = true;
        std::
        _Hashtable<int,std::pair<int_const,RCOAttribute>,std::allocator<std::pair<int_const,RCOAttribute>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<int&,RCOAttribute&>
                  ((_Hashtable<int,std::pair<int_const,RCOAttribute>,std::allocator<std::pair<int_const,RCOAttribute>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&local_170,&local_300,&local_2a8);
        goto LAB_00104f88;
      case ID_STR_LPB:
        uVar7 = *(uint *)((long)__dest + lVar8 + 8);
        memset(local_138,0,0x100);
        memcpy(local_138,this->mBuffer + (ulong)uVar7 + (ulong)(this->mHeader).id_str_start_off + 4,
               0xff);
        sVar5 = local_2a8.idstr._M_string_length;
        strlen((char *)local_138);
        std::__cxx11::string::_M_replace((long)&local_2a8 + 0xd0,0,(char *)sVar5,(ulong)local_138);
        break;
      case ID_STR:
        uVar7 = *(uint *)((long)__dest + lVar8 + 8);
        memset(local_138,0,0x100);
        memcpy(local_138,this->mBuffer + (ulong)uVar7 + (ulong)(this->mHeader).id_str_start_off + 4,
               0xff);
        sVar5 = local_2a8.idstr._M_string_length;
        strlen((char *)local_138);
        std::__cxx11::string::_M_replace((long)&local_2a8 + 0xd0,0,(char *)sVar5,(ulong)local_138);
        break;
      case ID_INT_LPB:
      case ID_INT:
        local_2a8.idint =
             *(uint32_t *)
              (this->mBuffer +
              (ulong)*(uint *)((long)__dest + lVar8 + 8) + 4 +
              (ulong)(this->mHeader).id_int_start_off);
        goto LAB_00104ed2;
      default:
        printf("unhandled type: %d\n");
LAB_00104ed2:
        bVar1 = false;
        goto LAB_00104f88;
      }
      bVar1 = false;
LAB_00104f88:
      iVar6 = std::__cxx11::string::compare((char *)&local_2a8);
      if (iVar6 == 0) {
        RCOAttribute::toString_abi_cxx11_(&local_190,&local_2a8);
        iVar6 = std::__cxx11::string::compare((char *)&local_190);
        bVar13 = iVar6 == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
      }
      else {
        bVar13 = false;
      }
      if (bVar13) {
        el->isCompressed = true;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_2a8);
        if (iVar6 == 0) {
          el->originalSize = local_2a8.i;
        }
      }
      if (!bVar1) {
        std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>::push_back(local_2d8,&local_2a8);
      }
      if (local_2a8.idstr._M_dataplus._M_p != (pointer)((long)&local_2a8 + 0xe0U)) {
        operator_delete(local_2a8.idstr._M_dataplus._M_p);
      }
      __dest = local_2d0;
      if (local_2a8.fileext._M_dataplus._M_p != (pointer)((long)&local_2a8 + 0xc0U)) {
        operator_delete(local_2a8.fileext._M_dataplus._M_p);
      }
      if (local_2a8.fa.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2a8.fa.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_2a8.ia.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2a8.ia.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2a8.c._M_dataplus._M_p != (pointer)((long)&local_2a8 + 0x60U)) {
        operator_delete(local_2a8.c._M_dataplus._M_p);
      }
      if (local_2a8.s._M_dataplus._M_p != (pointer)((long)&local_2a8 + 0x40U)) {
        operator_delete(local_2a8.s._M_dataplus._M_p);
      }
      if (local_2a8.name._M_dataplus._M_p != (undefined1 *)((long)&local_2a8 + 0x10U)) {
        operator_delete(local_2a8.name._M_dataplus._M_p);
      }
      uVar7 = (int)local_300 + 1;
      local_300 = (void *)CONCAT44(local_300._4_4_,uVar7);
      pvVar2 = local_2d8;
      _Var3._M_nxt = local_170._M_before_begin._M_nxt;
    } while (uVar7 < local_2dc);
  }
  for (; this_00 = local_2d8, local_2d8 = pvVar2, _Var3._M_nxt != (_Hash_node_base *)0x0;
      _Var3._M_nxt = (_Var3._M_nxt)->_M_nxt) {
    if (*(int *)&_Var3._M_nxt[6]._M_nxt == 8) {
      lVar8 = (long)*(int *)&_Var3._M_nxt[1]._M_nxt * 0x10;
      getFileData(this,(uint8_t **)(_Var3._M_nxt + 0x16),(uint32_t *)(_Var3._M_nxt + 0x17),
                  *(uint32_t *)((long)__dest + lVar8 + 8),*(uint32_t *)((long)__dest + lVar8 + 0xc),
                  el->isCompressed,el->originalSize);
    }
    std::vector<RCOAttribute,_std::allocator<RCOAttribute>_>::push_back
              (this_00,(value_type *)(_Var3._M_nxt + 2));
    pvVar2 = local_2d8;
    local_2d8 = this_00;
  }
  local_2a8.name._M_dataplus._M_p = (pointer)((long)&local_2a8 + 0x10);
  local_2a8.name._M_string_length = 0;
  local_2a8.name.field_2._M_local_buf[0] = '\0';
  local_300 = local_2f0;
  local_2f8 = 0;
  local_2f0[0] = 0;
  local_2c8 = local_2b8;
  local_2c0 = 0;
  local_2b8[0] = 0;
  iVar6 = std::__cxx11::string::compare((char *)el);
  if (iVar6 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_2a8,0,(char *)local_2a8.name._M_string_length,0x111212);
    pcVar10 = "xml";
LAB_00105275:
    puVar9 = (undefined1 *)&local_300;
  }
  else {
    iVar6 = std::__cxx11::string::compare((char *)el);
    pcVar10 = "textures";
    puVar9 = (undefined1 *)&local_2a8;
    if ((iVar6 != 0) && (iVar6 = std::__cxx11::string::compare((char *)el), iVar6 != 0)) {
      iVar6 = std::__cxx11::string::compare((char *)el);
      if (iVar6 != 0) {
        iVar6 = std::__cxx11::string::compare((char *)el);
        if (iVar6 != 0) goto LAB_0010528f;
        std::__cxx11::string::_M_replace
                  ((ulong)&local_2a8,0,(char *)local_2a8.name._M_string_length,0x111242);
        pcVar10 = "pslayout";
        goto LAB_00105275;
      }
      pcVar10 = "sounds";
    }
  }
  std::__cxx11::string::_M_replace((ulong)puVar9,0,*(char **)(puVar9 + 8),(ulong)pcVar10);
LAB_0010528f:
  pRVar11 = (el->attributes).super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (pRVar11 !=
      (el->attributes).super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar6 = std::__cxx11::string::compare((char *)pRVar11);
      if (iVar6 == 0) {
        RCOAttribute::toString_abi_cxx11_(local_138,pRVar11);
        std::__cxx11::string::operator=((string *)&local_2c8,(string *)local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
          operator_delete(local_138[0]._M_dataplus._M_p);
        }
      }
      iVar6 = std::__cxx11::string::compare((char *)pRVar11);
      if (iVar6 == 0) {
        RCOAttribute::toString_abi_cxx11_(&local_1b0,pRVar11);
        fileExtensionFromType(local_138,&local_1b0);
        std::__cxx11::string::operator=((string *)&local_300,(string *)local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
          operator_delete(local_138[0]._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
      }
      pRVar11 = pRVar11 + 1;
    } while (pRVar11 !=
             (el->attributes).super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  pRVar11 = (el->attributes).super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (pRVar11 !=
      (el->attributes).super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar12 = &pRVar11->s;
    do {
      pcVar10 = (char *)((long)(psVar12 + -2) + 0x10);
      iVar6 = std::__cxx11::string::compare(pcVar10);
      if (iVar6 == 0) {
        sprintf((char *)local_138,"%s/%s.%s",local_2a8.name._M_dataplus._M_p,local_2c8,local_300);
        pcVar10 = (char *)psVar12->_M_string_length;
        strlen((char *)local_138);
        std::__cxx11::string::_M_replace((ulong)psVar12,0,pcVar10,(ulong)local_138);
      }
      else {
        iVar6 = std::__cxx11::string::compare(pcVar10);
        if (iVar6 == 0) {
          sprintf((char *)local_138,"%s/%s_4k.%s",local_2a8.name._M_dataplus._M_p,local_2c8,
                  local_300);
          pcVar10 = (char *)psVar12->_M_string_length;
          strlen((char *)local_138);
          std::__cxx11::string::_M_replace((ulong)psVar12,0,pcVar10,(ulong)local_138);
        }
        else {
          iVar6 = std::__cxx11::string::compare(pcVar10);
          if (iVar6 == 0) {
            sprintf((char *)local_138,"%s/%s_right.%s",local_2a8.name._M_dataplus._M_p,local_2c8,
                    local_300);
            pcVar10 = (char *)psVar12->_M_string_length;
            strlen((char *)local_138);
            std::__cxx11::string::_M_replace((ulong)psVar12,0,pcVar10,(ulong)local_138);
          }
          else {
            iVar6 = std::__cxx11::string::compare(pcVar10);
            if (iVar6 == 0) {
              sprintf((char *)local_138,"%s/%s_left.%s",local_2a8.name._M_dataplus._M_p,local_2c8,
                      local_300);
              pcVar10 = (char *)psVar12->_M_string_length;
              strlen((char *)local_138);
              std::__cxx11::string::_M_replace((ulong)psVar12,0,pcVar10,(ulong)local_138);
            }
          }
        }
      }
      puVar4 = (uint32_t *)(psVar12 + 6);
      psVar12 = (string *)((long)(psVar12 + 7) + 0x18);
    } while ((pointer)(puVar4 + 2) !=
             (el->attributes).super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  operator_delete__(local_2d0);
  if ((undefined1 *)local_2c8 != local_2b8) {
    operator_delete(local_2c8);
  }
  if ((undefined1 *)local_300 != local_2f0) {
    operator_delete(local_300);
  }
  if (local_2a8.name._M_dataplus._M_p != (undefined1 *)((long)&local_2a8 + 0x10U)) {
    operator_delete(local_2a8.name._M_dataplus._M_p);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_RCOAttribute>,_std::allocator<std::pair<const_int,_RCOAttribute>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_170);
  return NO_ERROR;
}

Assistant:

RCOError RCO::loadAttributes(RCOElement &el, uint32_t offset, uint32_t count)
{
	std::vector<RCOAttribute> &attributes = el.attributes;

	rco_tree_table_element_attribute_raw *raw_attr = new rco_tree_table_element_attribute_raw[count];

	memcpy(raw_attr, mBuffer + offset, sizeof(rco_tree_table_element_attribute_raw) * count);

	std::unordered_map<int, RCOAttribute> filedata_indexes;

	// Handle all attributes apart from files
	for (int i = 0; i < count; i++)
	{
		RCOAttribute attr;

		rco_tree_table_element_attribute_raw &cur_attr = raw_attr[i];

		attr.type = static_cast<ATTRIBUTE_TYPE>(cur_attr.type);
		getStringTableString(attr.name, cur_attr.string_offset);

		bool deferred = false;

		switch (attr.type)
		{
		case CHAR:
			getCharTableChar(attr.c, cur_attr.c.offset, cur_attr.c.len);
			break;
		case STRING:
			getStringTableString(attr.s, cur_attr.s.offset, cur_attr.s.len);
			break;
		case ID_STR_LPB:
			getIdStringString(attr.idstr, cur_attr.id.offset, true);
			break;
		case ID_STR:
			getIdStringString(attr.idstr, cur_attr.id.offset);
			break;
		case STYLE_ID:
			getStyleId(attr.s, cur_attr.s.offset);
			break;
		case FLOAT:
			attr.f = cur_attr.f;
			break;
		case INTEGER:
			attr.i = cur_attr.i;
			break;
		case INTEGER_ARRAY:
			getIntArray(attr.ia, cur_attr.ia.offset, cur_attr.ia.num);
			break;
		case FLOAT_ARRAY:
			getFloatArray(attr.fa, cur_attr.fa.offset, cur_attr.fa.num);
			break;
		case ID_INT:
		case ID_INT_LPB:
			getIdIntInt(attr.idint, cur_attr.idref.offset);
			break;
		case DATA:
			filedata_indexes.emplace(i, attr);
			deferred = true;
			break;
		default:
			printf("unhandled type: %d\n", attr.type);
		}

		if (attr.name == "compress" && attr.toString() == "on")
			el.isCompressed = true;
		else if (attr.name == "origsize")
			el.originalSize = attr.i;

		if (!deferred)
			attributes.push_back(attr);
	}

	// Handle files afterwards (deferred)
	for (auto it = filedata_indexes.begin(), end = filedata_indexes.end(); it != end; it++)
	{
		int index = (*it).first;
		RCOAttribute &attr = (*it).second;

		if (attr.type == DATA)
		{
			getFileData(&attr.file, attr.filelen, raw_attr[index].file.offset, raw_attr[index].file.size, el.isCompressed, el.originalSize);
		}

		attributes.push_back(attr);
	}

	std::string path;
	std::string ext;
	std::string id;

	if (el.name == "locale")
	{
		path = "xmls";
		ext = "xml";
	}
	else if (el.name == "texture" || el.name == "override_texture")
	{
		path = "textures";
	}
	else if (el.name == "sounddata")
	{
		path = "sounds";
	}
	else if (el.name == "layout")
	{
		path = "layouts";
		// Just a binary file but makes sense to give it a separate ext
		ext = "pslayout";
	}

	for (auto it = attributes.begin(); it != attributes.end(); it++)
	{
		if ((*it).name == "id")
			id = (*it).toString();
		if ((*it).name == "type")
			ext = RCO::fileExtensionFromType((*it).toString());
	}

	for (auto it = attributes.begin(); it != attributes.end(); it++)
	{
		if ((*it).name == "src")
		{
			char buf[256];
			sprintf(buf, "%s/%s.%s", path.c_str(), id.c_str(), ext.c_str());
			(*it).s = buf;
		}
		else if ((*it).name == "src_4k")
		{
			char buf[256];
			sprintf(buf, "%s/%s_4k.%s", path.c_str(), id.c_str(), ext.c_str());
			(*it).s = buf;
		}
		else if ((*it).name == "right")
		{
			char buf[256];
			sprintf(buf, "%s/%s_right.%s", path.c_str(), id.c_str(), ext.c_str());
			(*it).s = buf;
		}
		else if ((*it).name == "left")
		{
			char buf[256];
			sprintf(buf, "%s/%s_left.%s", path.c_str(), id.c_str(), ext.c_str());
			(*it).s = buf;
		}
	}

	delete[] raw_attr;

	return NO_ERROR;
}